

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  byte bVar2;
  OfType OVar3;
  int iVar4;
  IStreamingReporter *pIVar5;
  AssertionResult *in_RSI;
  SourceLineInfo *in_RDI;
  Totals *in_stack_00000078;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000080;
  AssertionResult *in_stack_00000088;
  AssertionStats *in_stack_00000090;
  AssertionResult *in_stack_fffffffffffffdd8;
  AssertionStats *in_stack_fffffffffffffde0;
  AssertionResult *this_00;
  undefined1 *puVar6;
  Flags _resultDisposition;
  undefined7 in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe18;
  AssertionInfo *in_stack_fffffffffffffe20;
  allocator local_1b9;
  string local_1b8 [160];
  undefined1 local_118 [280];
  
  OVar3 = AssertionResult::getResultType(in_RSI);
  if (OVar3 == Ok) {
    in_RDI[6].line = in_RDI[6].line + 1;
  }
  else {
    bVar1 = AssertionResult::isOk((AssertionResult *)in_stack_fffffffffffffde0);
    if (!bVar1) {
      *(long *)(in_RDI + 7) = *(long *)(in_RDI + 7) + 1;
    }
  }
  pIVar5 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 8));
  puVar6 = local_118;
  AssertionStats::AssertionStats
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  iVar4 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar5,puVar6);
  _resultDisposition = (Flags)((ulong)puVar6 >> 0x20);
  bVar2 = (byte)iVar4;
  AssertionStats::~AssertionStats(in_stack_fffffffffffffde0);
  if ((bVar2 & 1) != 0) {
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1b8a40);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"",&local_1b9);
  this_00 = (AssertionResult *)&in_RDI[9].field_0x18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe20,"{Unknown expression after the reported line}",
             (allocator *)&stack0xfffffffffffffe1f);
  AssertionInfo::AssertionInfo
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_RDI,
             (string *)CONCAT17(bVar2,in_stack_fffffffffffffe08),_resultDisposition);
  AssertionInfo::operator=(&this_00->m_info,&in_stack_fffffffffffffdd8->m_info);
  AssertionInfo::~AssertionInfo(&this_00->m_info);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  AssertionResult::operator=(this_00,in_stack_fffffffffffffdd8);
  return;
}

Assistant:

virtual void assertionEnded( AssertionResult const& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;
            }

            if( m_reporter->assertionEnded( AssertionStats( result, m_messages, m_totals ) ) )
                m_messages.clear();

            // Reset working state
            m_lastAssertionInfo = AssertionInfo( "", m_lastAssertionInfo.lineInfo, "{Unknown expression after the reported line}" , m_lastAssertionInfo.resultDisposition );
            m_lastResult = result;
        }